

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LToken.cpp
# Opt level: O2

string * __thiscall LToken::str_abi_cxx11_(string *__return_storage_ptr__,LToken *this)

{
  ostream *poVar1;
  char *pcVar2;
  stringstream ss;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  switch(this->type) {
  case ADD:
    pcVar2 = "ADD";
    break;
  case BR:
    pcVar2 = "BR";
    break;
  case BRAC:
    pcVar2 = "BRAC";
    break;
  default:
    pcVar2 = "INVALID";
    break;
  case ELSE:
    pcVar2 = "ELSE";
    break;
  case END:
    pcVar2 = "END";
    break;
  case EOFF:
    pcVar2 = "EOFF";
    break;
  case EQ:
    pcVar2 = "EQ";
    break;
  case EQUAL:
    pcVar2 = "EQUAL";
    break;
  case FUNCTION:
    pcVar2 = "FUNCTION";
    break;
  case G:
    pcVar2 = "G";
    break;
  case GEQ:
    pcVar2 = "GEQ";
    break;
  case IF:
    pcVar2 = "IF";
    break;
  case INT:
    pcVar2 = "INT: ";
    goto LAB_001111fb;
  case KET:
    pcVar2 = "KET";
    break;
  case L:
    pcVar2 = "L";
    break;
  case LEQ:
    pcVar2 = "LEQ";
    break;
  case NEQ:
    pcVar2 = "NEQ";
    break;
  case SUB:
    pcVar2 = "SUB";
    break;
  case THEN:
    pcVar2 = "THEN";
    break;
  case VAR:
    pcVar2 = "VAR: ";
LAB_001111fb:
    poVar1 = std::operator<<(local_188,pcVar2);
    std::operator<<(poVar1,(string *)&this->token);
    goto LAB_0011129e;
  }
  std::operator<<(local_188,pcVar2);
LAB_0011129e:
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  return __return_storage_ptr__;
}

Assistant:

std::string LToken::str() {
    std::stringstream ss;
    switch (this->type) {
        case LNodeType::INT:
            ss << "INT: " << this->token;
            break;
        case LNodeType::VAR:
            ss << "VAR: " << this->token;
            break;
        case LNodeType::EQUAL:
            ss << "EQUAL";
            break;
        case LNodeType::L:
            ss << "L";
            break;
        case LNodeType::G:
            ss << "G";
            break;
        case LNodeType::BRAC:
            ss << "BRAC";
            break;
        case LNodeType::KET:
            ss << "KET";
            break;
        case LNodeType::BR:
            ss << "BR";
            break;
        case LNodeType::ADD:
            ss << "ADD";
            break;
        case LNodeType::SUB:
            ss << "SUB";
            break;
        case LNodeType::EQ:
            ss << "EQ";
            break;
        case LNodeType::NEQ:
            ss << "NEQ";
            break;
        case LNodeType::LEQ:
            ss << "LEQ";
            break;
        case LNodeType::GEQ:
            ss << "GEQ";
            break;
        case LNodeType::FUNCTION:
            ss << "FUNCTION";
            break;
        case LNodeType::IF:
            ss << "IF";
            break;
        case LNodeType::THEN:
            ss << "THEN";
            break;
        case LNodeType::ELSE:
            ss << "ELSE";
            break;
        case LNodeType::END:
            ss << "END";
            break;
        case LNodeType::EOFF:
            ss << "EOFF";
            break;
        default:
            ss << "INVALID";
            break;
    }
    return ss.str();
}